

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  long lVar1;
  LogMessage *other;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  pFVar3 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (((~(byte)pFVar3[1] & 0x60) == 0) ||
     ((((pDVar2 = FieldDescriptor::message_type(pFVar3), pDVar2 == (Descriptor *)0x0 &&
        (((byte)pFVar3[1] & 2) == 0)) && (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) != '\x02')) &&
      ((lVar1 = *(long *)(pFVar3 + 0x28), lVar1 == 0 || ((byte)pFVar3[1] & 0x10) == 0 ||
       ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))))))) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_enum_field_lite.cc"
               ,0x1b0);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: HasHazzer(descriptor_): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,HAZZER,false);
  variables = &(this->super_ImmutableEnumFieldLiteGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  pFVar3 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  if (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) == '\x03') {
    WriteFieldEnumValueAccessorDocComment(printer,pFVar3,GETTER,false);
    io::Printer::Print(printer,variables,
                       "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Value$}$() {\n  return instance.get$capitalized_name$Value();\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
    WriteFieldEnumValueAccessorDocComment
              (printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,SETTER,true);
    io::Printer::Print(printer,variables,
                       "$deprecation$public Builder ${$set$capitalized_name$Value$}$(int value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Value(value);\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
    pFVar3 = (this->super_ImmutableEnumFieldLiteGenerator).descriptor_;
  }
  WriteFieldAccessorDocComment(printer,pFVar3,GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,SETTER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,CLEARER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  GOOGLE_DCHECK(HasHazzer(descriptor_));
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return instance.has$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, GETTER);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public int ${$get$capitalized_name$Value$}$() {\n"
        "  return instance.get$capitalized_name$Value();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, SETTER,
                                          /* builder */ true);
    printer->Print(variables_,
                   "$deprecation$public Builder "
                   "${$set$capitalized_name$Value$}$(int value) {\n"
                   "  copyOnWrite();\n"
                   "  instance.set$capitalized_name$Value(value);\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return instance.get$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}